

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerStLoopBodyCount(Lowerer *this,Instr *instr)

{
  intptr_t iVar1;
  MemRefOpnd *newDst;
  RegOpnd *this_00;
  Opnd *newSrc;
  undefined1 local_40 [8];
  AutoReuseOpnd autoReuse;
  
  iVar1 = JITTimeWorkItem::GetLoopHeaderAddr(this->m_func->m_workItem);
  newDst = IR::MemRefOpnd::New((void *)(iVar1 + 0x14),TyUint32,this->m_func,AddrOpndKindDynamicMisc)
  ;
  IR::Instr::SetDst(instr,&newDst->super_Opnd);
  this_00 = IR::Opnd::AsRegOpnd(instr->m_src1);
  newSrc = IR::Opnd::UseWithNewType(&this_00->super_Opnd,TyUint32,this->m_func);
  IR::Instr::ReplaceSrc1(instr,newSrc);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_40,&newDst->super_Opnd,this->m_func,true);
  LowererMD::ChangeToAssign(instr);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_40);
  return;
}

Assistant:

void
Lowerer::LowerStLoopBodyCount(IR::Instr* instr)
{
    intptr_t header = m_func->m_workItem->GetLoopHeaderAddr();

    IR::MemRefOpnd *loopBodyCounterOpnd = IR::MemRefOpnd::New((BYTE*)(header) + Js::LoopHeader::GetOffsetOfProfiledLoopCounter(), TyUint32, this->m_func);
    instr->SetDst(loopBodyCounterOpnd);
    instr->ReplaceSrc1(instr->GetSrc1()->AsRegOpnd()->UseWithNewType(TyUint32, this->m_func));
    IR::AutoReuseOpnd autoReuse(loopBodyCounterOpnd, this->m_func);
    m_lowererMD.ChangeToAssign(instr);
    return;
}